

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# h264d_api.c
# Opt level: O0

MPP_RET h264d_parse(void *decoder,HalDecTask *in_task)

{
  H264dErrCtx_t *p_err;
  H264_DecCtx_t *p_Dec;
  MPP_RET ret;
  HalDecTask *in_task_local;
  void *decoder_local;
  
  in_task->valid = 0;
  *(HalDecTask **)((long)decoder + 0xa8) = in_task;
  *(undefined4 *)((long)decoder + 0xbc) = 0;
  *(undefined4 *)((long)decoder + 0xc0) = 0;
  *(undefined1 *)((long)decoder + 0x5e) = 0;
  if (*(long *)(*(long *)((long)decoder + 0x40) + 0x1910) != 0) {
    memset(*(void **)(*(long *)((long)decoder + 0x40) + 0x1910),0,0xf8);
  }
  p_Dec._4_4_ = parse_loop((H264_DecCtx_t *)decoder);
  if (p_Dec._4_4_ != MPP_OK) {
    (in_task->flags).val = (in_task->flags).val & 0xfffffffffffffffb | 4;
  }
  if (*(char *)((long)decoder + 0x5e) != '\0') {
    *(undefined1 *)((long)decoder + 0x5e) = 0;
    *(int *)(*(long *)((long)decoder + 0x48) + 0xcf0) =
         *(int *)(*(long *)((long)decoder + 0x48) + 0xcf0) + 1;
    p_Dec._4_4_ = update_dpb((H264_DecCtx_t *)decoder);
    if (p_Dec._4_4_ != MPP_OK) {
      (in_task->flags).val = (in_task->flags).val & 0xfffffffffffffff7 | 8;
    }
    if (((in_task->flags).val & 1) != 0) {
      h264d_flush_dpb_eos((H264_DecCtx_t *)decoder);
    }
  }
  in_task->valid = 1;
  if (((in_task->flags).val >> 2 & 1) == 0) {
    (in_task->syntax).number = *(RK_U32 *)(*(long *)((long)decoder + 0x30) + 0xbc0);
    (in_task->syntax).data = *(void **)(*(long *)((long)decoder + 0x30) + 0xbc8);
    (in_task->flags).val =
         (in_task->flags).val & 0xffffffffffffffef |
         ((ulong)*(uint *)((long)decoder + 0xc0) & 1) << 4;
    (in_task->flags).val =
         (in_task->flags).val & 0xfffffffffffffff7 |
         (ulong)((uint)((in_task->flags).val >> 3) & 1 |
                (uint)(*(int *)((long)decoder + 0xc4) != 0 || *(int *)((long)decoder + 0xbc) != 0))
         << 3;
  }
  return p_Dec._4_4_;
}

Assistant:

MPP_RET h264d_parse(void *decoder, HalDecTask *in_task)
{
    MPP_RET ret = MPP_ERR_UNKNOW;
    H264_DecCtx_t *p_Dec = (H264_DecCtx_t *)decoder;
    H264dErrCtx_t *p_err = &p_Dec->errctx;

    in_task->valid = 0;
    p_Dec->in_task = in_task;
    p_err->cur_err_flag  = 0;
    p_err->used_ref_flag = 0;
    p_Dec->is_parser_end = 0;
    if (p_Dec->p_Cur->sei)
        memset(p_Dec->p_Cur->sei, 0, sizeof(*p_Dec->p_Cur->sei));

    ret = parse_loop(p_Dec);
    if (ret) {
        in_task->flags.parse_err = 1;
    }

    if (p_Dec->is_parser_end) {
        p_Dec->is_parser_end = 0;
        p_Dec->p_Vid->g_framecnt++;
        ret = update_dpb(p_Dec);
        if (ret) {
            in_task->flags.ref_err = 1;
        }
        if (in_task->flags.eos) {
            h264d_flush_dpb_eos(p_Dec);
        }
    }
    in_task->valid = 1;
    if (!in_task->flags.parse_err) {
        in_task->syntax.number = p_Dec->dxva_ctx->syn.num;
        in_task->syntax.data   = (void *)p_Dec->dxva_ctx->syn.buf;
        in_task->flags.used_for_ref = p_err->used_ref_flag;
        in_task->flags.ref_err |= (p_err->dpb_err_flag | p_err->cur_err_flag) ? 1 : 0;
    }

    return ret;
}